

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  ImGui_ImplOpenGL3_Data *pIVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  GLenum current_clip_origin;
  undefined8 local_74;
  undefined8 uStack_6c;
  float local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar1 = ImGui_ImplOpenGL3_GetBackendData();
  (*imgl3wProcs.ptr[0x1a])(0xbe2);
  (*imgl3wProcs.ptr[6])(0x8006);
  (*imgl3wProcs.ptr[8])(0x302,0x303,1,0x303);
  (*imgl3wProcs.ptr[0x16])(0xb44);
  (*imgl3wProcs.ptr[0x16])(0xb71);
  (*imgl3wProcs.ptr[0x16])(0xb90);
  (*imgl3wProcs.ptr[0x1a])(0xc11);
  if (0x135 < pIVar1->GlVersion) {
    (*imgl3wProcs.ptr[0x16])(0x8f9d);
  }
  if (pIVar1->HasPolygonMode == true) {
    (*imgl3wProcs.ptr[0x30])(0x408,0x1b02);
  }
  bVar2 = true;
  if (pIVar1->HasClipOrigin == true) {
    current_clip_origin = 0;
    (*imgl3wProcs.ptr[0x22])(0x935c,&current_clip_origin);
    bVar2 = current_clip_origin != 0x8ca2;
  }
  (*imgl3wProcs.ptr[0x3a])(0,0,(ulong)(uint)fb_width,(ulong)(uint)fb_height);
  local_74 = 0;
  uStack_6c = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0xbf800000;
  fVar3 = (draw_data->DisplayPos).x;
  fVar4 = (draw_data->DisplayPos).y;
  fVar5 = (draw_data->DisplaySize).x + fVar3;
  fVar6 = (draw_data->DisplaySize).y + fVar4;
  fVar7 = fVar6;
  fVar8 = fVar4;
  if (!bVar2) {
    fVar7 = fVar4;
    fVar8 = fVar6;
  }
  current_clip_origin = (GLenum)(2.0 / (fVar5 - fVar3));
  local_64 = 2.0 / (fVar8 - fVar7);
  auVar9._0_4_ = fVar3 + fVar5;
  auVar9._4_4_ = fVar4 + fVar6;
  auVar9._8_8_ = 0;
  auVar10._4_4_ = fVar7 - fVar8;
  auVar10._0_4_ = fVar3 - fVar5;
  auVar10._8_4_ = fVar4 - fVar6;
  auVar10._12_4_ = fVar7 - fVar8;
  auVar10 = divps(auVar9,auVar10);
  local_48 = auVar10._0_8_;
  uStack_40 = 0x3f80000000000000;
  (*imgl3wProcs.ptr[0x38])((ulong)pIVar1->ShaderHandle);
  (*imgl3wProcs.ptr[0x36])((ulong)(uint)pIVar1->AttribLocationTex,0);
  (*imgl3wProcs.ptr[0x37])((ulong)(uint)pIVar1->AttribLocationProjMtx,1,0,&current_clip_origin);
  if ((0x149 < pIVar1->GlVersion) || (pIVar1->GlProfileIsES3 == true)) {
    (*imgl3wProcs.ptr[3])(0,0);
  }
  (*imgl3wProcs.ptr[5])((ulong)vertex_array_object);
  (*imgl3wProcs.ptr[2])(0x8892,(ulong)pIVar1->VboHandle);
  (*imgl3wProcs.ptr[2])(0x8893,(ulong)pIVar1->ElementsHandle);
  (*imgl3wProcs.ptr[0x1b])((ulong)pIVar1->AttribLocationVtxPos);
  (*imgl3wProcs.ptr[0x1b])((ulong)pIVar1->AttribLocationVtxUV);
  (*imgl3wProcs.ptr[0x1b])((ulong)pIVar1->AttribLocationVtxColor);
  (*imgl3wProcs.ptr[0x39])((ulong)pIVar1->AttribLocationVtxPos,2,0x1406,0,0x14,0);
  (*imgl3wProcs.ptr[0x39])((ulong)pIVar1->AttribLocationVtxUV,2,0x1406,0,0x14,8);
  (*imgl3wProcs.ptr[0x39])((ulong)pIVar1->AttribLocationVtxColor,4,0x1401,1,0x14,0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    ImGui_ImplOpenGL3_Data* bd = ImGui_ImplOpenGL3_GetBackendData();

    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (bd->GlVersion >= 310)
        glDisable(GL_PRIMITIVE_RESTART);
#endif
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_POLYGON_MODE
    if (bd->HasPolygonMode)
        glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
#if defined(GL_CLIP_ORIGIN)
    bool clip_origin_lower_left = true;
    if (bd->HasClipOrigin)
    {
        GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
        if (current_clip_origin == GL_UPPER_LEFT)
            clip_origin_lower_left = false;
    }
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    GL_CALL(glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height));
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
#if defined(GL_CLIP_ORIGIN)
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
#endif
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(bd->ShaderHandle);
    glUniform1i(bd->AttribLocationTex, 0);
    glUniformMatrix4fv(bd->AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (bd->GlVersion >= 330 || bd->GlProfileIsES3)
        glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 and GL ES 3.0 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifdef IMGUI_IMPL_OPENGL_USE_VERTEX_ARRAY
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    GL_CALL(glBindBuffer(GL_ARRAY_BUFFER, bd->VboHandle));
    GL_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, bd->ElementsHandle));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxPos));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxUV));
    GL_CALL(glEnableVertexAttribArray(bd->AttribLocationVtxColor));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, pos)));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, uv)));
    GL_CALL(glVertexAttribPointer(bd->AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE, sizeof(ImDrawVert), (GLvoid*)offsetof(ImDrawVert, col)));
}